

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O1

sunrealtype ** SUNDlsMat_newDenseMat(sunindextype m,sunindextype n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sunrealtype **__ptr;
  sunrealtype *psVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [16];
  uint uVar8;
  
  if ((0 < m && 0 < n) && (__ptr = (sunrealtype **)malloc(n * 8), __ptr != (sunrealtype **)0x0)) {
    *__ptr = (sunrealtype *)0x0;
    psVar3 = (sunrealtype *)malloc(m * n * 8);
    *__ptr = psVar3;
    auVar2 = _DAT_0010c050;
    auVar1 = _DAT_0010c040;
    if (psVar3 != (sunrealtype *)0x0) {
      if (n < 2) {
        return __ptr;
      }
      lVar5 = n + -2;
      auVar6._8_4_ = (int)lVar5;
      auVar6._0_8_ = lVar5;
      auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar8 = (uint)((ulong)m >> 0x20);
      auVar7._8_4_ = (int)m;
      auVar7._0_8_ = m;
      auVar7._12_4_ = uVar8;
      uVar9 = 1;
      uVar10 = 2;
      uVar4 = 0;
      auVar6 = auVar6 ^ _DAT_0010c050;
      do {
        auVar11._8_4_ = (int)uVar4;
        auVar11._0_8_ = uVar4;
        auVar11._12_4_ = (int)(uVar4 >> 0x20);
        auVar11 = (auVar11 | auVar1) ^ auVar2;
        psVar3 = *__ptr;
        if ((bool)(~(auVar11._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar11._0_4_ ||
                    auVar6._4_4_ < auVar11._4_4_) & 1)) {
          __ptr[uVar4 + 1] =
               psVar3 + (uVar9 & 0xffffffff) * (m & 0xffffffffU) +
                        ((uVar9 & 0xffffffff) * (ulong)uVar8 + (uVar9 >> 0x20) * (m & 0xffffffffU)
                        << 0x20);
        }
        if ((auVar11._12_4_ != auVar6._12_4_ || auVar11._8_4_ <= auVar6._8_4_) &&
            auVar11._12_4_ <= auVar6._12_4_) {
          __ptr[uVar4 + 2] =
               psVar3 + (uVar10 & 0xffffffff) * (m & 0xffffffffU) +
                        ((uVar10 & 0xffffffff) * (auVar7._8_8_ >> 0x20) +
                         (uVar10 >> 0x20) * (m & 0xffffffffU) << 0x20);
        }
        uVar4 = uVar4 + 2;
        uVar9 = uVar9 + 2;
        uVar10 = uVar10 + 2;
      } while ((n & 0x7ffffffffffffffeU) != uVar4);
      return __ptr;
    }
    free(__ptr);
  }
  return (sunrealtype **)0x0;
}

Assistant:

sunrealtype** SUNDlsMat_newDenseMat(sunindextype m, sunindextype n)
{
  sunindextype j;
  sunrealtype** a;

  if ((n <= 0) || (m <= 0)) { return (NULL); }

  a = NULL;
  a = (sunrealtype**)malloc(n * sizeof(sunrealtype*));
  if (a == NULL) { return (NULL); }

  a[0] = NULL;
  a[0] = (sunrealtype*)malloc(m * n * sizeof(sunrealtype));
  if (a[0] == NULL)
  {
    free(a);
    a = NULL;
    return (NULL);
  }

  for (j = 1; j < n; j++) { a[j] = a[0] + j * m; }

  return (a);
}